

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutMerge.c
# Opt level: O1

Cut_Cut_t * Cut_CutMergeTwo(Cut_Man_t *p,Cut_Cut_t *pCut0,Cut_Cut_t *pCut1)

{
  uint uVar1;
  Cut_Cut_t *pCVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar6 = *(uint *)pCut0;
  uVar11 = uVar6 >> 0x1c;
  uVar12 = *(uint *)pCut1 >> 0x1c;
  if (uVar11 < uVar12) {
    __assert_fail("pCut0->nLeaves >= pCut1->nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cut/cutMerge.c"
                  ,0xb1,"Cut_Cut_t *Cut_CutMergeTwo(Cut_Man_t *, Cut_Cut_t *, Cut_Cut_t *)");
  }
  uVar3 = p->pParams->nVarsMax;
  if (uVar12 == uVar3 && uVar11 == uVar3) {
    if (0xfffffff < uVar6) {
      uVar4 = 0;
      do {
        if (*(int *)(&pCut0[1].field_0x0 + uVar4 * 4) != *(int *)(&pCut1[1].field_0x0 + uVar4 * 4))
        {
          return (Cut_Cut_t *)0x0;
        }
        uVar4 = uVar4 + 1;
      } while (uVar11 != uVar4);
    }
    pCVar2 = Cut_CutAlloc(p);
    if (0xfffffff < uVar6) {
      uVar4 = 0;
      do {
        *(undefined4 *)(&pCVar2[1].field_0x0 + uVar4 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + uVar4 * 4);
        uVar4 = uVar4 + 1;
      } while (uVar11 != uVar4);
    }
  }
  else {
    if (uVar11 != uVar3) {
      if (p->pReady == (Cut_Cut_t *)0x0) {
        pCVar2 = Cut_CutAlloc(p);
        p->pReady = pCVar2;
      }
      pCVar2 = p->pReady;
      if ((int)uVar3 < 1) {
        uVar10 = 0;
        uVar7 = 0;
        uVar6 = 0;
      }
      else {
        iVar5 = 0;
        uVar4 = 0;
        uVar7 = 0;
        uVar10 = 0;
        do {
          if (uVar7 == uVar12) {
            if (uVar10 == uVar11) {
              uVar6 = (*(uint *)pCVar2 & 0xfffffff) - iVar5;
              goto LAB_008c2d6e;
            }
            lVar9 = (long)(int)uVar10;
            uVar10 = uVar10 + 1;
            uVar6 = *(uint *)(&pCut0[1].field_0x0 + lVar9 * 4);
LAB_008c2d17:
            *(uint *)((long)&pCVar2[1].field_0x0 + uVar4 * 4) = uVar6;
          }
          else {
            if (uVar10 == uVar11) {
              lVar9 = (long)(int)uVar7;
              uVar7 = uVar7 + 1;
              uVar6 = *(uint *)(&pCut1[1].field_0x0 + lVar9 * 4);
              goto LAB_008c2d17;
            }
            uVar6 = *(uint *)(&pCut0[1].field_0x0 + (long)(int)uVar10 * 4);
            uVar1 = *(uint *)(&pCut1[1].field_0x0 + (long)(int)uVar7 * 4);
            if ((int)uVar6 < (int)uVar1) {
              uVar10 = uVar10 + 1;
              goto LAB_008c2d17;
            }
            if ((int)uVar1 < (int)uVar6) {
              uVar7 = uVar7 + 1;
              *(uint *)((long)&pCVar2[1].field_0x0 + uVar4 * 4) = uVar1;
            }
            else {
              uVar10 = uVar10 + 1;
              *(uint *)((long)&pCVar2[1].field_0x0 + uVar4 * 4) = uVar6;
              uVar7 = uVar7 + 1;
            }
          }
          uVar4 = uVar4 + 1;
          iVar5 = iVar5 + -0x10000000;
        } while (uVar3 != uVar4);
        uVar6 = -iVar5;
      }
      if ((int)uVar10 < (int)uVar11) {
        return (Cut_Cut_t *)0x0;
      }
      if ((int)uVar7 < (int)uVar12) {
        return (Cut_Cut_t *)0x0;
      }
      uVar6 = *(uint *)pCVar2 & 0xfffffff | uVar6;
LAB_008c2d6e:
      *(uint *)pCVar2 = uVar6;
      pCVar2 = p->pReady;
      p->pReady = (Cut_Cut_t *)0x0;
      return pCVar2;
    }
    if (0xfffffff < *(uint *)pCut1) {
      uVar3 = uVar6 >> 0x1c;
      uVar8 = 0;
      uVar4 = (ulong)uVar3;
LAB_008c2c42:
      do {
        iVar5 = uVar3 - uVar11;
        if (0 < (long)uVar4) {
          lVar9 = uVar4 * 4;
          uVar4 = uVar4 - 1;
          if (*(int *)((long)&pCut0->pNext + lVar9 + 4) != *(int *)(&pCut1[1].field_0x0 + uVar8 * 4)
             ) goto LAB_008c2c42;
          iVar5 = 1;
        }
        if (iVar5 == 0) {
          return (Cut_Cut_t *)0x0;
        }
        uVar8 = uVar8 + 1;
        uVar4 = (ulong)uVar3;
      } while (uVar8 != uVar12);
    }
    pCVar2 = Cut_CutAlloc(p);
    if (0xfffffff < uVar6) {
      uVar4 = 0;
      do {
        *(undefined4 *)(&pCVar2[1].field_0x0 + uVar4 * 4) =
             *(undefined4 *)(&pCut0[1].field_0x0 + uVar4 * 4);
        uVar4 = uVar4 + 1;
      } while (uVar11 != uVar4);
    }
  }
  *(uint *)pCVar2 = *(uint *)pCVar2 & 0xfffffff | *(uint *)pCut0 & 0xf0000000;
  return pCVar2;
}

Assistant:

Cut_Cut_t * Cut_CutMergeTwo( Cut_Man_t * p, Cut_Cut_t * pCut0, Cut_Cut_t * pCut1 )
{ 
    Cut_Cut_t * pRes;
    int * pLeaves;
    int Limit, nLeaves0, nLeaves1;
    int i, k, c;

    assert( pCut0->nLeaves >= pCut1->nLeaves );

    // consider two cuts
    nLeaves0 = pCut0->nLeaves;
    nLeaves1 = pCut1->nLeaves;

    // the case of the largest cut sizes
    Limit = p->pParams->nVarsMax;
    if ( nLeaves0 == Limit && nLeaves1 == Limit )
    {
        for ( i = 0; i < nLeaves0; i++ )
            if ( pCut0->pLeaves[i] != pCut1->pLeaves[i] )
                return NULL;
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = pCut0->nLeaves;
        return pRes;
    }
    // the case when one of the cuts is the largest
    if ( nLeaves0 == Limit )
    {
        for ( i = 0; i < nLeaves1; i++ )
        {
            for ( k = nLeaves0 - 1; k >= 0; k-- )
                if ( pCut0->pLeaves[k] == pCut1->pLeaves[i] )
                    break;
            if ( k == -1 ) // did not find
                return NULL;
        }
        pRes = Cut_CutAlloc( p );
        for ( i = 0; i < nLeaves0; i++ )
            pRes->pLeaves[i] = pCut0->pLeaves[i];
        pRes->nLeaves = pCut0->nLeaves;
        return pRes;
    }

    // prepare the cut
    if ( p->pReady == NULL )
        p->pReady = Cut_CutAlloc( p );
    pLeaves = p->pReady->pLeaves;

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < Limit; c++ )
    {
        if ( k == nLeaves1 )
        {
            if ( i == nLeaves0 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( i == nLeaves0 )
        {
            if ( k == nLeaves1 )
            {
                p->pReady->nLeaves = c;
                pRes = p->pReady;  p->pReady = NULL;
                return pRes;
            }
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        if ( pCut0->pLeaves[i] < pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut0->pLeaves[i++];
            continue;
        }
        if ( pCut0->pLeaves[i] > pCut1->pLeaves[k] )
        {
            pLeaves[c] = pCut1->pLeaves[k++];
            continue;
        }
        pLeaves[c] = pCut0->pLeaves[i++]; 
        k++;
    }
    if ( i < nLeaves0 || k < nLeaves1 )
        return NULL;
    p->pReady->nLeaves = c;
    pRes = p->pReady;  p->pReady = NULL;
    return pRes;
}